

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O2

bool __thiscall
Opcode::AABBTreeOfVerticesBuilder::ComputeGlobalBox
          (AABBTreeOfVerticesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  ulong uVar1;
  
  if (nb_prims != 0 && primitives != (udword *)0x0) {
    (global_box->mCenter).x = 0.0;
    (global_box->mCenter).y = 0.0;
    *(undefined8 *)&(global_box->mCenter).z = 0xff7fffff00000000;
    (global_box->mExtents).y = -3.4028235e+38;
    (global_box->mExtents).z = -3.4028235e+38;
    for (uVar1 = 0; nb_prims != uVar1; uVar1 = uVar1 + 1) {
      IceMaths::AABB::Extend(global_box,this->mVertexArray + primitives[uVar1]);
    }
  }
  return nb_prims != 0 && primitives != (udword *)0x0;
}

Assistant:

bool AABBTreeOfVerticesBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	global_box.SetEmpty();

	// Loop through vertices
	for(udword i=0;i<nb_prims;i++)
	{
		// Update global box
		global_box.Extend(mVertexArray[primitives[i]]);
	}
	return true;
}